

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QList<QAccessibleInterface_*> * __thiscall
QAccessibleTableCell::columnHeaderCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleTableCell *this)

{
  Data *pDVar1;
  int index_;
  QHeaderView *pQVar2;
  QAccessibleTableHeaderCell *this_00;
  QObject *view_;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = horizontalHeader(this);
  if (pQVar2 != (QHeaderView *)0x0) {
    this_00 = (QAccessibleTableHeaderCell *)operator_new(0x20);
    pDVar1 = (this->view).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      view_ = (QObject *)0x0;
    }
    else {
      view_ = (this->view).wp.value;
    }
    index_ = QPersistentModelIndex::column();
    QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
              (this_00,(QAbstractItemView *)view_,index_,Horizontal);
    QList<QAccessibleInterface_*>::append(__return_storage_ptr__,(parameter_type)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QAccessibleInterface*> QAccessibleTableCell::columnHeaderCells() const
{
    QList<QAccessibleInterface*> headerCell;
    if (horizontalHeader()) {
        // FIXME
        headerCell.append(new QAccessibleTableHeaderCell(view, m_index.column(), Qt::Horizontal));
    }
    return headerCell;
}